

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O0

DOMTreeWalker * __thiscall
xercesc_4_0::DOMDocumentImpl::createTreeWalker
          (DOMDocumentImpl *this,DOMNode *root,ShowType whatToShow,DOMNodeFilter *filter,
          bool entityReferenceExpansion)

{
  DOMException *this_00;
  MemoryManager *memoryManager;
  DOMTreeWalkerImpl *this_01;
  bool entityReferenceExpansion_local;
  DOMNodeFilter *filter_local;
  ShowType whatToShow_local;
  DOMNode *root_local;
  DOMDocumentImpl *this_local;
  
  if (root == (DOMNode *)0x0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    memoryManager = getMemoryManager(this);
    DOMException::DOMException(this_00,9,0,memoryManager);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  this_01 = (DOMTreeWalkerImpl *)operator_new(0x30,this);
  DOMTreeWalkerImpl::DOMTreeWalkerImpl(this_01,root,whatToShow,filter,entityReferenceExpansion);
  return &this_01->super_DOMTreeWalker;
}

Assistant:

DOMTreeWalker* DOMDocumentImpl::createTreeWalker (
  DOMNode *root,
  DOMNodeFilter::ShowType whatToShow,
  DOMNodeFilter* filter,
  bool entityReferenceExpansion)
{
    if (!root) {
        throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, getMemoryManager());
        return 0;
    }

    return new (this) DOMTreeWalkerImpl(root, whatToShow, filter, entityReferenceExpansion);
}